

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t solaris_sparse_parse(archive_read *a,tar *tar,archive_entry *entry,char *p)

{
  wchar_t wVar1;
  int64_t iVar2;
  bool bVar3;
  uint local_4c;
  long lStack_48;
  wchar_t hole;
  int64_t end;
  int64_t start;
  char *e;
  char *p_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_4c = 1;
  lStack_48 = 0;
  if (*p == ' ') {
    e = p + 1;
    while( true ) {
      start = (int64_t)e;
      while( true ) {
        bVar3 = false;
        if (*(char *)start != '\0') {
          bVar3 = *(char *)start != ' ';
        }
        if (!bVar3) break;
        if ((*(char *)start < '0') || ('9' < *(char *)start)) {
          return L'\xffffffec';
        }
        start = start + 1;
      }
      iVar2 = tar_atol10(e,start - (long)e);
      if (iVar2 < 0) {
        return L'\xffffffec';
      }
      if (lStack_48 < iVar2) {
        wVar1 = gnu_add_sparse_entry(a,tar,lStack_48,iVar2 - lStack_48);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        tar->sparse_last->hole = local_4c;
      }
      if (*(char *)start == '\0') break;
      e = (char *)(start + 1);
      local_4c = (uint)(local_4c == 0);
      lStack_48 = iVar2;
    }
    a_local._4_4_ = L'\0';
  }
  else {
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
solaris_sparse_parse(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *p)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (*p == ' ')
		p++;
	else
		return (ARCHIVE_WARN);
	for (;;) {
		e = p;
		while (*e != '\0' && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
		hole = hole == 0;
	}
}